

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::reset(CmdLine *this)

{
  bool bVar1;
  reference ppAVar2;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_RDI;
  ArgListIterator it;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(in_RDI);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(in_RDI);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x18c8f1)
    ;
    (*(*ppAVar2)->_vptr_Arg[0xd])();
    std::_List_iterator<TCLAP::Arg_*>::operator++(local_10,0);
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

inline void CmdLine::reset()
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		(*it)->reset();
	
	_progName.clear();
}